

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int xmlRegExecGetValues(xmlRegExecCtxtPtr exec,int err,int *nbval,int *nbneg,xmlChar **values,
                       int *terminal)

{
  int iVar1;
  xmlRegexpPtr pxVar2;
  xmlRegTrans *pxVar3;
  long lVar4;
  xmlRegCounter *pxVar5;
  xmlRegStatePtr pxVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  xmlRegStatePtr pxVar12;
  undefined4 in_R10D;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  xmlChar *pxVar18;
  undefined1 auVar19 [16];
  
  auVar19._0_4_ = -(uint)(exec == (xmlRegExecCtxtPtr)0x0);
  auVar19._4_4_ = -(uint)(nbval == (int *)0x0);
  auVar19._8_4_ = -(uint)(nbneg == (int *)0x0);
  auVar19._12_4_ = -(uint)(values == (xmlChar **)0x0);
  iVar13 = movmskps(in_R10D,auVar19);
  if ((iVar13 != 0) || (iVar13 = *nbval, iVar13 < 1)) {
    return -1;
  }
  *nbval = 0;
  *nbneg = 0;
  pxVar2 = exec->comp;
  if ((pxVar2 == (xmlRegexpPtr)0x0) || (pxVar2->compact == (int *)0x0)) {
    if (terminal != (int *)0x0) {
      *terminal = (uint)(exec->state->type == XML_REGEXP_FINAL_STATE);
    }
    if (err == 0) {
      pxVar12 = exec->state;
    }
    else {
      pxVar12 = exec->errState;
    }
    if (pxVar12 == (xmlRegStatePtr)0x0) {
      return -1;
    }
    if (0 < pxVar12->nbTrans) {
      lVar7 = 0x88;
      if (err == 0) {
        lVar7 = 0x40;
      }
      iVar9 = 0;
      lVar14 = 0x10;
      lVar8 = 1;
      do {
        pxVar3 = pxVar12->trans;
        lVar15 = (long)*(int *)((long)pxVar3 + lVar14 + -8);
        if ((((-1 < lVar15) && (lVar4 = *(long *)((long)pxVar3 + lVar14 + -0x10), lVar4 != 0)) &&
            (pxVar18 = *(xmlChar **)(lVar4 + 0x18), pxVar18 != (xmlChar *)0x0)) &&
           ((*(uint *)((long)&pxVar3->atom + lVar14) & 0xfffffffe) != 0x123456)) {
          lVar16 = (long)*(int *)((long)pxVar3 + lVar14 + -4);
          if (lVar16 < 0) {
            if (((exec->comp != (xmlRegexpPtr)0x0) &&
                (pxVar6 = exec->comp->states[lVar15], pxVar6 != (xmlRegStatePtr)0x0)) &&
               (pxVar6->type != XML_REGEXP_SINK_STATE)) goto LAB_0017b9bf;
          }
          else if (((exec->comp == (xmlRegexpPtr)0x0) ||
                   (pxVar5 = exec->comp->counters, pxVar5 == (xmlRegCounter *)0x0)) ||
                  (*(int *)(*(long *)((long)&exec->status + lVar7) + lVar16 * 4) <
                   pxVar5[lVar16].max)) {
LAB_0017b9bf:
            if (*(int *)(lVar4 + 0x28) != 0) {
              pxVar18 = *(xmlChar **)(lVar4 + 0x20);
            }
            values[iVar9] = pxVar18;
            iVar9 = iVar9 + 1;
            *nbval = *nbval + 1;
          }
        }
        uVar17 = (ulong)pxVar12->nbTrans;
        if ((long)uVar17 <= lVar8) break;
        lVar14 = lVar14 + 0x18;
        lVar8 = lVar8 + 1;
      } while (iVar9 < iVar13);
      if (iVar13 <= iVar9 || pxVar12->nbTrans < 1) {
        return 0;
      }
      lVar7 = 0x10;
      lVar8 = 1;
      while( true ) {
        pxVar3 = pxVar12->trans;
        lVar14 = (long)*(int *)((long)pxVar3 + lVar7 + -8);
        if (((((-1 < lVar14) && (lVar15 = *(long *)((long)pxVar3 + lVar7 + -0x10), lVar15 != 0)) &&
             (pxVar18 = *(xmlChar **)(lVar15 + 0x18), pxVar18 != (xmlChar *)0x0)) &&
            (((*(uint *)((long)&pxVar3->atom + lVar7) & 0xfffffffe) != 0x123456 &&
             (*(int *)((long)pxVar3 + lVar7 + -4) < 0)))) &&
           ((pxVar6 = exec->comp->states[lVar14], pxVar6 != (xmlRegStatePtr)0x0 &&
            (pxVar6->type == XML_REGEXP_SINK_STATE)))) {
          if (*(int *)(lVar15 + 0x28) != 0) {
            pxVar18 = *(xmlChar **)(lVar15 + 0x20);
          }
          values[iVar9] = pxVar18;
          iVar9 = iVar9 + 1;
          *nbneg = *nbneg + 1;
          uVar17 = (ulong)(uint)pxVar12->nbTrans;
        }
        if ((int)uVar17 <= lVar8) break;
        lVar7 = lVar7 + 0x18;
        lVar8 = lVar8 + 1;
        if (iVar13 <= iVar9) {
          return 0;
        }
      }
      return 0;
    }
  }
  else {
    if (err == 0) {
      iVar9 = exec->index;
    }
    else {
      iVar9 = exec->errStateNo;
      if (iVar9 == -1) {
        return -1;
      }
    }
    if (terminal != (int *)0x0) {
      *terminal = (uint)(pxVar2->compact[(long)iVar9 * ((long)pxVar2->nbstrings + 1)] == 2);
    }
    iVar11 = pxVar2->nbstrings;
    if (0 < iVar11) {
      lVar7 = 0;
      iVar10 = 0;
      do {
        iVar1 = pxVar2->compact[(iVar11 + 1) * iVar9 + lVar7 + 1];
        if (((0 < iVar1) && (iVar1 <= pxVar2->nbstates)) &&
           (pxVar2->compact[(iVar1 + -1) * (iVar11 + 1)] != 4)) {
          lVar8 = (long)iVar10;
          iVar10 = iVar10 + 1;
          values[lVar8] = pxVar2->stringMap[lVar7];
          *nbval = *nbval + 1;
          iVar11 = pxVar2->nbstrings;
        }
        lVar7 = lVar7 + 1;
      } while ((lVar7 < iVar11) && (iVar10 < iVar13));
      if (iVar10 < iVar13 && 0 < iVar11) {
        lVar7 = 0;
        while( true ) {
          iVar1 = pxVar2->compact[(iVar11 + 1) * iVar9 + lVar7 + 1];
          if (((0 < iVar1) && (iVar1 <= pxVar2->nbstates)) &&
             (pxVar2->compact[(iVar1 + -1) * (iVar11 + 1)] == 4)) {
            lVar8 = (long)iVar10;
            iVar10 = iVar10 + 1;
            values[lVar8] = pxVar2->stringMap[lVar7];
            *nbneg = *nbneg + 1;
            iVar11 = pxVar2->nbstrings;
          }
          lVar7 = lVar7 + 1;
          if (iVar11 <= lVar7) break;
          if (iVar13 <= iVar10) {
            return 0;
          }
        }
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

static int
xmlRegExecGetValues(xmlRegExecCtxtPtr exec, int err,
                    int *nbval, int *nbneg,
		    xmlChar **values, int *terminal) {
    int maxval;
    int nb = 0;

    if ((exec == NULL) || (nbval == NULL) || (nbneg == NULL) ||
        (values == NULL) || (*nbval <= 0))
        return(-1);

    maxval = *nbval;
    *nbval = 0;
    *nbneg = 0;
    if ((exec->comp != NULL) && (exec->comp->compact != NULL)) {
        xmlRegexpPtr comp;
	int target, i, state;

        comp = exec->comp;

	if (err) {
	    if (exec->errStateNo == -1) return(-1);
	    state = exec->errStateNo;
	} else {
	    state = exec->index;
	}
	if (terminal != NULL) {
	    if (comp->compact[state * (comp->nbstrings + 1)] ==
	        XML_REGEXP_FINAL_STATE)
		*terminal = 1;
	    else
		*terminal = 0;
	}
	for (i = 0;(i < comp->nbstrings) && (nb < maxval);i++) {
	    target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	    if ((target > 0) && (target <= comp->nbstates) &&
	        (comp->compact[(target - 1) * (comp->nbstrings + 1)] !=
		 XML_REGEXP_SINK_STATE)) {
	        values[nb++] = comp->stringMap[i];
		(*nbval)++;
	    }
	}
	for (i = 0;(i < comp->nbstrings) && (nb < maxval);i++) {
	    target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	    if ((target > 0) && (target <= comp->nbstates) &&
	        (comp->compact[(target - 1) * (comp->nbstrings + 1)] ==
		 XML_REGEXP_SINK_STATE)) {
	        values[nb++] = comp->stringMap[i];
		(*nbneg)++;
	    }
	}
    } else {
        int transno;
	xmlRegTransPtr trans;
	xmlRegAtomPtr atom;
	xmlRegStatePtr state;

	if (terminal != NULL) {
	    if (exec->state->type == XML_REGEXP_FINAL_STATE)
		*terminal = 1;
	    else
		*terminal = 0;
	}

	if (err) {
	    if (exec->errState == NULL) return(-1);
	    state = exec->errState;
	} else {
	    if (exec->state == NULL) return(-1);
	    state = exec->state;
	}
	for (transno = 0;
	     (transno < state->nbTrans) && (nb < maxval);
	     transno++) {
	    trans = &state->trans[transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    if ((atom == NULL) || (atom->valuep == NULL))
		continue;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
	        /* this should not be reached but ... */
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
	        /* this should not be reached but ... */
	    } else if (trans->counter >= 0) {
		xmlRegCounterPtr counter = NULL;
		int count;

		if (err)
		    count = exec->errCounts[trans->counter];
		else
		    count = exec->counts[trans->counter];
		if (exec->comp != NULL)
		    counter = &exec->comp->counters[trans->counter];
		if ((counter == NULL) || (count < counter->max)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbval)++;
		}
	    } else {
                if ((exec->comp != NULL) && (exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type !=
		     XML_REGEXP_SINK_STATE)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbval)++;
		}
	    }
	}
	for (transno = 0;
	     (transno < state->nbTrans) && (nb < maxval);
	     transno++) {
	    trans = &state->trans[transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    if ((atom == NULL) || (atom->valuep == NULL))
		continue;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
	        continue;
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
	        continue;
	    } else if (trans->counter >= 0) {
	        continue;
	    } else {
                if ((exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type ==
		     XML_REGEXP_SINK_STATE)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbneg)++;
		}
	    }
	}
    }
    return(0);
}